

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

Gazetteer * __thiscall CoreML::Specification::Model::mutable_gazetteer(Model *this)

{
  bool bVar1;
  Gazetteer *this_00;
  Model *this_local;
  
  bVar1 = has_gazetteer(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_gazetteer(this);
    this_00 = (Gazetteer *)operator_new(0x38);
    CoreMLModels::Gazetteer::Gazetteer(this_00);
    (this->Type_).gazetteer_ = this_00;
  }
  return (Gazetteer *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::Gazetteer* Model::mutable_gazetteer() {
  if (!has_gazetteer()) {
    clear_Type();
    set_has_gazetteer();
    Type_.gazetteer_ = new ::CoreML::Specification::CoreMLModels::Gazetteer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.gazetteer)
  return Type_.gazetteer_;
}